

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O3

void __thiscall mocker::ir::Branch::~Branch(Branch *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this[-1].else_.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__Branch_00124298;
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Branch_001242b8;
  p_Var1 = (this->then).super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->condition).super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->super_Terminator)._vptr_Terminator
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  operator_delete(&this[-1].else_,0x48);
  return;
}

Assistant:

Branch(std::shared_ptr<Addr> condition, std::shared_ptr<Label> then,
         std::shared_ptr<Label> else_)
      : IRInst(InstType::Branch), condition(std::move(condition)),
        then(std::move(then)), else_(std::move(else_)) {}